

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::Picker::wheelEvent(Picker *this,QWheelEvent *event)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  if (*(long *)(event + 0x50) == 0) {
    lVar2 = *(long *)(event + 0x58);
    if (lVar2 == 0) goto LAB_0016f429;
    iVar3 = (int)((ulong)lVar2 >> 0x20);
    iVar4 = iVar3 + 7;
    if (-1 < lVar2) {
      iVar4 = iVar3;
    }
    iVar4 = iVar4 >> 3;
  }
  else {
    iVar4 = (int)((ulong)*(long *)(event + 0x50) >> 0x20);
  }
  piVar1 = &((this->d).d)->drawItemOffset;
  *piVar1 = *piVar1 + iVar4;
  QWidget::update();
LAB_0016f429:
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void
Picker::wheelEvent( QWheelEvent * event )
{
	QPoint numPixels = event->pixelDelta();
	QPoint numDegrees = event->angleDelta();

	if( !numPixels.isNull() )
	{
		d->drawItemOffset += numPixels.y();
		update();
	}
	else if( !numDegrees.isNull() )
	{
		d->drawItemOffset += numDegrees.y() / 8;
		update();
	}

	event->accept();
}